

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<sptk::uint24_t,_sptk::int24_t>::Run
          (DataTransform<sptk::uint24_t,_sptk::int24_t> *this,istream *input_stream)

{
  byte bVar1;
  byte bVar2;
  NumericType NVar3;
  WarningType WVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  undefined8 uVar9;
  char *pcVar10;
  char *extraout_RAX;
  ulong uVar11;
  ostream *poVar12;
  size_t sVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int24_t *piVar21;
  uint uVar22;
  uint uVar23;
  uint8_t uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  uint24_t input_data;
  string word;
  char buffer [128];
  uint24_t local_29b;
  int local_298;
  int24_t local_290;
  int24_t local_28d;
  ushort local_28a;
  ulong local_288;
  int24_t *local_280;
  int24_t *local_278;
  int local_26c;
  istream *local_268;
  ulong local_260;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  undefined7 extraout_var;
  
  local_278 = &this->minimum_value_;
  local_280 = &this->maximum_value_;
  local_238 = &this->print_format_;
  uVar28 = 0;
  local_268 = input_stream;
  do {
    local_29b.value[0] = '\0';
    local_29b.value[1] = '\0';
    local_29b.value[2] = '\0';
    iVar7 = (int)uVar28;
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(local_268,(string *)&local_230);
      pcVar10 = local_230;
      if (local_228 == 0) {
        bVar5 = true;
        bVar6 = false;
      }
      else {
        piVar8 = __errno_location();
        iVar27 = *piVar8;
        *piVar8 = 0;
        strtold(pcVar10,(char **)&local_258);
        if (local_258._M_dataplus._M_p == pcVar10) {
          uVar9 = std::__throw_invalid_argument("stold");
LAB_0013106b:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar9);
        }
        if (*piVar8 == 0) {
          *piVar8 = iVar27;
        }
        else if (*piVar8 == 0x22) {
          uVar9 = std::__throw_out_of_range("stold");
          goto LAB_0013106b;
        }
        local_28a = in_FPUControlWord | 0xc00;
        local_26c = (int)ROUND(in_ST0);
        local_29b.value = SUB43(local_26c,0);
        bVar5 = false;
        bVar6 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      pcVar10 = local_220;
      if (local_230 != pcVar10) {
        operator_delete(local_230);
        pcVar10 = extraout_RAX;
      }
      if (bVar6) goto LAB_00130c15;
      if (bVar5) {
        if (!bVar5) {
          return false;
        }
        goto LAB_00131010;
      }
    }
    else {
      bVar6 = sptk::ReadStream<sptk::uint24_t>(&local_29b,local_268);
      pcVar10 = (char *)CONCAT71(extraout_var,bVar6);
      if (!bVar6) {
LAB_00131010:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar7 % this->num_column_ != 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          return true;
        }
        return true;
      }
LAB_00130c15:
      local_298 = (int)CONCAT71((int7)((ulong)pcVar10 >> 8),local_29b.value[0]);
      uVar11 = (ulong)local_29b.value[0];
      bVar16 = (this->minimum_value_).value[2];
      uVar20 = (uint)bVar16 * 0x10000;
      uVar25 = (uint)(this->minimum_value_).value[1];
      uVar22 = uVar25 * 0x100;
      uVar26 = (uint)(this->minimum_value_).value[0];
      uVar14 = uVar20 + uVar26 | uVar22;
      uVar23 = uVar14 | 0xff000000;
      if (-1 < (char)bVar16) {
        uVar23 = uVar14;
      }
      bVar1 = (this->maximum_value_).value[2];
      uVar17 = (uint)bVar1 * 0x10000;
      bVar2 = (this->maximum_value_).value[1];
      uVar18 = (uint)bVar2 * 0x100;
      uVar19 = (uint)(this->maximum_value_).value[0];
      uVar15 = uVar17 + uVar19 | uVar18;
      uVar14 = uVar15 | 0xff000000;
      if (-1 < (char)bVar1) {
        uVar14 = uVar15;
      }
      uVar15 = (uint)(ushort)local_29b.value._1_2_;
      local_288._0_4_ = (uint)local_29b.value[0];
      local_288 = uVar11;
      local_260 = uVar28;
      if ((int)uVar14 <= (int)uVar23) goto LAB_00130e8b;
      NVar3 = this->input_numeric_type_;
      piVar21 = local_278;
      if (NVar3 == kFloatingPoint) {
        lVar29 = (ulong)(ushort)local_29b.value._1_2_ * 0x100 + uVar11;
        uVar23 = (uVar22 - 0x1000000) + (uVar20 | uVar26);
        if (-1 < (char)bVar16) {
          uVar23 = uVar20 | uVar26 | uVar22;
        }
        if ((int)uVar23 <= lVar29) {
          uVar23 = (uVar18 - 0x1000000) + (uVar17 | uVar19);
          if (-1 < (char)bVar1) {
            uVar23 = uVar17 | uVar19 | uVar18;
          }
          piVar21 = local_280;
          uVar25 = (uint)bVar2;
          bVar16 = bVar1;
          if (lVar29 <= (int)uVar23) goto LAB_00130e8b;
        }
LAB_00130dda:
        uVar24 = (uint8_t)uVar25;
        local_298 = (int)CONCAT71(0xff0000,piVar21->value[0]);
        uVar15 = uVar25;
        if (this->warning_type_ == kIgnore) {
LAB_00130ecd:
          uVar24 = (uint8_t)uVar15;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar4 == kExit) {
            return false;
          }
        }
      }
      else {
        if (NVar3 == kUnsignedInteger) {
          uVar14 = uVar15 * 0x100 + (uint)local_288;
          uVar23 = (uVar22 - 0x1000000) + (uVar20 | uVar26);
          if (-1 < (char)bVar16) {
            uVar23 = uVar20 | uVar26 | uVar22;
          }
          if (uVar23 <= uVar14) {
            uVar23 = (uVar18 - 0x1000000) + (uVar17 | uVar19);
            if (-1 < (char)bVar1) {
              uVar23 = uVar17 | uVar19 | uVar18;
            }
            piVar21 = local_280;
            uVar25 = (uint)bVar2;
            bVar16 = bVar1;
            if (uVar14 <= uVar23) goto LAB_00130e8b;
          }
          goto LAB_00130dda;
        }
        if (NVar3 == kSignedInteger) {
          iVar27 = uVar15 * 0x100 + (uint)local_288;
          uVar23 = (uVar22 - 0x1000000) + (uVar20 | uVar26);
          if (-1 < (char)bVar16) {
            uVar23 = uVar20 | uVar26 | uVar22;
          }
          if ((int)uVar23 <= iVar27) {
            uVar23 = (uVar18 - 0x1000000) + (uVar17 | uVar19);
            if (-1 < (char)bVar1) {
              uVar23 = uVar17 | uVar19 | uVar18;
            }
            piVar21 = local_280;
            uVar25 = (uint)bVar2;
            bVar16 = bVar1;
            if (iVar27 <= (int)uVar23) goto LAB_00130e8b;
          }
          goto LAB_00130dda;
        }
LAB_00130e8b:
        if (this->rounding_ != true) {
          bVar16 = local_29b.value[2];
          goto LAB_00130ecd;
        }
        if (local_29b.value == (uint8_t  [3])0x0) {
          bVar16 = 0;
          uVar24 = '\0';
          local_298 = 0;
        }
        else {
          local_298 = (int)((double)(uint3)local_29b.value + 0.5);
          uVar24 = (uint8_t)((uint)local_298 >> 8);
          bVar16 = (byte)((uint)local_298 >> 0x10);
        }
      }
      if (this->is_ascii_output_ == true) {
        local_28d.value[0] = (uint8_t)local_298;
        local_28d.value[1] = uVar24;
        local_28d.value[2] = bVar16;
        bVar6 = sptk::SnPrintf<sptk::int24_t>(&local_28d,local_238,0x80,local_b8);
        if (!bVar6) {
          return false;
        }
        sVar13 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar13);
        if ((iVar7 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        local_290.value[0] = (uint8_t)local_298;
        local_290.value[1] = uVar24;
        local_290.value[2] = bVar16;
        bVar6 = sptk::WriteStream<sptk::int24_t>(&local_290,(ostream *)&std::cout);
        if (!bVar6) {
          return false;
        }
      }
    }
    uVar28 = (ulong)(iVar7 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }